

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.h
# Opt level: O0

void __thiscall absl::lts_20240722::Cord::Cord(Cord *this,Cord *src)

{
  Cord *src_local;
  Cord *this_local;
  
  InlineRep::InlineRep(&this->contents_,&src->contents_);
  return;
}

Assistant:

inline Cord::Cord(const Cord& src) : contents_(src.contents_) {}